

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O1

void ImPlot::FitNextPlotAxes(bool x,bool y,bool y2,bool y3)

{
  ImPlotContext *pIVar1;
  
  pIVar1 = GImPlot;
  if (GImPlot->CurrentPlot == (ImPlotPlot *)0x0) {
    (GImPlot->NextPlotData).FitX = x;
    (pIVar1->NextPlotData).FitY[0] = y;
    (pIVar1->NextPlotData).FitY[1] = y2;
    (pIVar1->NextPlotData).FitY[2] = y3;
    return;
  }
  __assert_fail("(gp.CurrentPlot == __null) && \"FitNextPlotAxes() needs to be called before BeginPlot()!\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                ,0xa20,"void ImPlot::FitNextPlotAxes(bool, bool, bool, bool)");
}

Assistant:

void FitNextPlotAxes(bool x, bool y, bool y2, bool y3) {
    ImPlotContext& gp = *GImPlot;
    IM_ASSERT_USER_ERROR(gp.CurrentPlot == NULL, "FitNextPlotAxes() needs to be called before BeginPlot()!");
    gp.NextPlotData.FitX = x;
    gp.NextPlotData.FitY[0] = y;
    gp.NextPlotData.FitY[1] = y2;
    gp.NextPlotData.FitY[2] = y3;
}